

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O2

void __thiscall capnp::MallocMessageBuilder::~MallocMessageBuilder(MallocMessageBuilder *this)

{
  void **ppvVar1;
  void **ppvVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  Fault f;
  Fault local_20;
  
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__MallocMessageBuilder_00673618;
  if (this->returnedFirstSegment == true) {
    if (this->ownFirstSegment == true) {
      free(this->firstSegment);
    }
    else {
      AVar3 = MessageBuilder::getSegmentsForOutput(&this->super_MessageBuilder);
      if (AVar3.size_ != 0) {
        if ((AVar3.ptr)->ptr != (word *)this->firstSegment) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[76]>
                    (&local_20,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
                     ,0xe0,FAILED,"segments[0].begin() == firstSegment",
                     "\"First segment in getSegmentsForOutput() is not the first segment allocated?\""
                     ,(char (*) [76])
                      "First segment in getSegmentsForOutput() is not the first segment allocated?")
          ;
          kj::_::Debug::Fault::fatal(&local_20);
        }
        memset((word *)this->firstSegment,0,(AVar3.ptr)->size_ << 3);
      }
    }
    ppvVar1 = (this->moreSegments).builder.pos;
    for (ppvVar2 = (this->moreSegments).builder.ptr; ppvVar2 != ppvVar1; ppvVar2 = ppvVar2 + 1) {
      free(*ppvVar2);
    }
  }
  kj::ArrayBuilder<void_*>::dispose(&(this->moreSegments).builder);
  FlatMessageBuilder::~FlatMessageBuilder((FlatMessageBuilder *)this);
  return;
}

Assistant:

MallocMessageBuilder::~MallocMessageBuilder() noexcept(false) {
  if (returnedFirstSegment) {
    if (ownFirstSegment) {
      free(firstSegment);
    } else {
      // Must zero first segment.
      kj::ArrayPtr<const kj::ArrayPtr<const word>> segments = getSegmentsForOutput();
      if (segments.size() > 0) {
        KJ_ASSERT(segments[0].begin() == firstSegment,
            "First segment in getSegmentsForOutput() is not the first segment allocated?");
        memset(firstSegment, 0, segments[0].size() * sizeof(word));
      }
    }

    for (void* ptr: moreSegments) {
      free(ptr);
    }
  }
}